

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compact.cpp
# Opt level: O0

void print_usage(string *exec_name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000030;
  char (*in_stack_00000038) [53];
  FILE *in_stack_00000040;
  
  fmt::v6::
  print<char[38],_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
            (in_stack_00000040,(char (*) [38])in_stack_00000038,in_stack_00000030);
  fmt::v6::print<char[53],_0>(in_stack_00000040,in_stack_00000038);
  return;
}

Assistant:

void print_usage(const std::string &exec_name) {
    // clang-format off
    fmt::print(stderr, "Usage: {} [option] /path/to/database\n", exec_name);
    fmt::print(stderr, "    [-1]     compact a single round, default: false\n");
    // clang-format on
}